

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O1

void str_utf8_trim_whitespaces_right(char *str)

{
  int iVar1;
  size_t sVar2;
  long in_FS_OFFSET;
  char *last;
  char *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  sVar2 = strlen(str);
  local_28 = str + (int)sVar2;
  do {
    iVar1 = str_utf8_decode(&local_28);
    iVar1 = str_utf8_is_whitespace(iVar1);
    if (iVar1 == 0) break;
    iVar1 = (int)sVar2;
    str[iVar1] = '\0';
    if (iVar1 == 0) {
      sVar2 = 0;
    }
    else {
      sVar2 = (size_t)(iVar1 - 1);
    }
    local_28 = str + (int)sVar2;
  } while ((int)sVar2 != 0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void str_utf8_trim_whitespaces_right(char *str)
{
	int cursor = str_length(str);
	const char *last = str + cursor;
	while(str_utf8_is_whitespace(str_utf8_decode(&last)))
	{
		str[cursor] = 0;
		cursor = str_utf8_rewind(str, cursor);
		last = str + cursor;
		if(cursor == 0)
		{
			break;
		}
	}
}